

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5IntegrityMethod(sqlite3_vtab *pVtab,char *zSchema,char *zTabname,int isQuick,char **pzErr)

{
  char *pcVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long *in_R8;
  Fts5Storage *unaff_retaddr;
  int rc;
  Fts5FullTable *pTab;
  uint local_34;
  
  *(long **)(*(long *)(in_RDI + 0x18) + 0xf8) = in_R8;
  local_34 = sqlite3Fts5StorageIntegrity(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  if ((*in_R8 == 0) && (local_34 != 0)) {
    if ((local_34 & 0xff) == 0xb) {
      pcVar1 = sqlite3_mprintf("malformed inverted index for FTS5 table %s.%s",in_RSI,in_RDX);
      *in_R8 = (long)pcVar1;
      local_34 = 7;
      if (*in_R8 != 0) {
        local_34 = 0;
      }
    }
    else {
      pcVar1 = sqlite3_errstr(0);
      pcVar1 = sqlite3_mprintf("unable to validate the inverted index for FTS5 table %s.%s: %s",
                               in_RSI,in_RDX,pcVar1);
      *in_R8 = (long)pcVar1;
    }
  }
  sqlite3Fts5IndexCloseReader((Fts5Index *)0x264d83);
  *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0xf8) = 0;
  return local_34;
}

Assistant:

static int fts5IntegrityMethod(
  sqlite3_vtab *pVtab,    /* the FTS5 virtual table to check */
  const char *zSchema,    /* Name of schema in which this table lives */
  const char *zTabname,   /* Name of the table itself */
  int isQuick,            /* True if this is a quick-check */
  char **pzErr            /* Write error message here */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  int rc;

  assert( pzErr!=0 && *pzErr==0 );
  UNUSED_PARAM(isQuick);
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = pzErr;
  rc = sqlite3Fts5StorageIntegrity(pTab->pStorage, 0);
  if( *pzErr==0 && rc!=SQLITE_OK ){
    if( (rc&0xff)==SQLITE_CORRUPT ){
      *pzErr = sqlite3_mprintf("malformed inverted index for FTS5 table %s.%s",
          zSchema, zTabname);
      rc = (*pzErr) ? SQLITE_OK : SQLITE_NOMEM;
    }else{
      *pzErr = sqlite3_mprintf("unable to validate the inverted index for"
          " FTS5 table %s.%s: %s",
          zSchema, zTabname, sqlite3_errstr(rc));
    }
  }

  sqlite3Fts5IndexCloseReader(pTab->p.pIndex);
  pTab->p.pConfig->pzErrmsg = 0;

  return rc;
}